

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

bool ml_two_byte_SHIFT_JIS(char *p,char *head)

{
  byte bVar1;
  bool local_26;
  bool local_25;
  byte *pbStack_20;
  int x;
  char *head_local;
  char *p_local;
  
  pbStack_20 = (byte *)head;
  while (pbStack_20 < p) {
    bVar1 = *pbStack_20;
    if (((bVar1 < 0x81) || (0x9f < bVar1)) && ((bVar1 < 0xe0 || (0xfc < bVar1)))) {
      pbStack_20 = pbStack_20 + 1;
    }
    else {
      pbStack_20 = pbStack_20 + 2;
    }
  }
  if (pbStack_20 == (byte *)p) {
    bVar1 = *pbStack_20;
    if ((bVar1 < 0x81) || (local_25 = true, 0x9f < bVar1)) {
      local_26 = 0xdf < bVar1 && bVar1 < 0xfd;
      local_25 = local_26;
    }
    p_local._7_1_ = local_25;
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool
ml_two_byte_SHIFT_JIS(const char *p, const char *head)
{
  int x;

  while (head < p) {
    x = (*head) & 0xFF;
    if (FBSJIS(x))
      head += 2;
    else
      head++;
  }
  if (head == p) {
    x = (*head) & 0xFF;
    return (FBSJIS(x));
  }
  return (false);
}